

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

int rtosc::canonicalize_arg_vals(rtosc_arg_val_t *av,size_t n,char *port_args,MetaContainer meta)

{
  char cVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  rtosc_arg_val_t *in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  bool bVar5;
  int val;
  size_t i;
  char *first;
  size_t a;
  rtosc_arg_val_t *start;
  bool is_array;
  size_t max;
  size_t arr_size;
  int errors_found;
  char *first0;
  bool local_82;
  rtosc_arg_val_t *in_stack_ffffffffffffff80;
  ulong local_70;
  char *local_68;
  ulong local_60;
  bool local_49;
  ulong local_48;
  ulong local_40;
  undefined4 in_stack_ffffffffffffffc8;
  MetaContainer meta_00;
  char *local_18;
  int local_4;
  
  local_4 = 0;
  while( true ) {
    local_82 = false;
    if (((*in_RDX != '\0') && (local_82 = true, *in_RDX != ':')) &&
       (local_82 = true, *in_RDX != '[')) {
      local_82 = *in_RDX == ']';
    }
    if (local_82 == false) break;
    in_RDX = in_RDX + 1;
  }
  cVar1 = *in_RDI;
  if (cVar1 != 'a') {
    local_40 = 1;
    local_48 = in_RSI;
    local_18 = in_RDI;
  }
  else {
    iVar2 = rtosc_av_arr_len((rtosc_arg_val_t *)0x1063ba);
    local_40 = (ulong)iVar2;
    local_18 = in_RDI + 0x18;
    local_48 = 1;
  }
  local_49 = cVar1 == 'a';
  local_60 = 0;
  local_68 = in_RDX;
  do {
    if (local_40 <= local_60) {
      if ((local_49) && (local_40 != 0)) {
        rtosc_av_arr_type_set(in_stack_ffffffffffffff80,local_82);
      }
      return local_4;
    }
    meta_00.str_ptr = local_68;
    for (local_70 = 0; local_70 < local_48; local_70 = local_70 + 1) {
      while( true ) {
        bVar5 = false;
        if ((*local_68 != '\0') && (bVar5 = true, *local_68 != '[')) {
          bVar5 = *local_68 == ']';
        }
        if (!bVar5) break;
        local_68 = local_68 + 1;
      }
      if ((*local_68 == '\0') || (*local_68 == ':')) {
        return (int)in_RSI - (int)local_70;
      }
      if ((*local_18 == 'S') && (*local_68 == 'i')) {
        in_stack_ffffffffffffff80 = in_RCX;
        iVar3 = enum_key(meta_00,(char *)CONCAT44(local_4,in_stack_ffffffffffffffc8));
        iVar4 = std::numeric_limits<int>::min();
        if (iVar3 == iVar4) {
          local_4 = local_4 + 1;
        }
        else {
          *local_18 = 'i';
          *(int *)(local_18 + 8) = iVar3;
        }
      }
      local_68 = local_68 + 1;
      local_18 = local_18 + 0x18;
    }
    local_60 = local_60 + 1;
    local_68 = meta_00.str_ptr;
  } while( true );
}

Assistant:

int rtosc::canonicalize_arg_vals(rtosc_arg_val_t* av, size_t n,
                                 const char* port_args,
                                 Port::MetaContainer meta)
{
    const char* first0 = port_args;
    int errors_found = 0;

    // skip "[]:"
    for( ; *first0 && (*first0 == ':' || *first0 == '[' || *first0 == ']');
           ++first0) ;

    size_t arr_size;
    size_t max;
    bool is_array;
    rtosc_arg_val_t* start = av;
    if(av->type == 'a') {
        arr_size = rtosc_av_arr_len(av);
        ++av;
        max = 1; // only one element per bundle element
                 // TODO: multiple may be possible
        is_array = true;
    }
    else {
        arr_size = 1;
        max = n;
        is_array = false;
    }

    for(size_t a = 0; a < arr_size; ++a)
    {
        const char* first = first0;
        for(size_t i = 0; i < max; ++i, ++first, ++av)
        {
            // skip "[]"
            for( ; *first && (*first == '[' || *first == ']'); ++first) ;

            assert(!strchr(first0, '#'));

//            if(is_array) // TODO: currently, only one element per bundle element
//                assert(first[1] == 0);

            if(!*first || *first == ':')
            {
                // (n-i) arguments left, but we have no recipe to convert them
                return n-i;
            }

            if(av->type == 'S' && *first == 'i')
            {
                int val = enum_key(meta, av->val.s);
                if(val == std::numeric_limits<int>::min())
                    ++errors_found;
                else
                {
                    av->type = 'i';
                    av->val.i = val;
                }
            }
        }
    }
    if(is_array && arr_size)
        rtosc_av_arr_type_set(start, av[-1].type);

    return errors_found;
}